

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorInfo.hpp
# Opt level: O2

void __thiscall
helics::TranslatorInfo::TranslatorInfo
          (TranslatorInfo *this,GlobalHandle handle,string_view key_,string_view endpointType,
          string_view units)

{
  string_view pkey;
  string_view key__00;
  string_view key__01;
  string_view ptype;
  string_view type_;
  allocator<char> local_49;
  string_view key__local;
  
  key__local._M_str = key_._M_str;
  key__local._M_len = key_._M_len;
  this->id = handle;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&this->key,(basic_string_view<char,_std::char_traits<char>_> *)&key__local,
             &local_49);
  this->flags = 0;
  (this->tranOp).super___shared_ptr<helics::TranslatorOperator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->tranOp).super___shared_ptr<helics::TranslatorOperator,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pkey._M_str = key__local._M_str;
  pkey._M_len = key__local._M_len;
  ptype._M_str = "any";
  ptype._M_len = 3;
  PublicationInfo::PublicationInfo(&this->pub,handle,pkey,ptype,units);
  key__00._M_str = key__local._M_str;
  key__00._M_len = key__local._M_len;
  type_._M_str = "any";
  type_._M_len = 3;
  InputInfo::InputInfo(&this->ipt,handle,key__00,type_,units);
  key__01._M_str = key__local._M_str;
  key__01._M_len = key__local._M_len;
  EndpointInfo::EndpointInfo(&this->ept,handle,key__01,endpointType);
  return;
}

Assistant:

TranslatorInfo(GlobalHandle handle,
                   std::string_view key_,
                   std::string_view endpointType,
                   std::string_view units):
        id(handle), key(key_), pub(handle, key_, "any", units), ipt(handle, key_, "any", units),
        ept(handle, key_, endpointType)
    {
    }